

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)12>_> *
vkt::api::anon_unknown_1::BufferView::create
          (Move<vk::Handle<(vk::HandleType)12>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *params)

{
  VkBufferViewCreateInfo local_40;
  
  local_40.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_40.pNext = (void *)0x0;
  local_40.flags = 0;
  local_40.buffer.m_internal =
       (res->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_40.format = params->format;
  local_40.offset = params->offset;
  local_40.range = params->range;
  ::vk::createBufferView
            (__return_storage_ptr__,env->vkd,env->device,&local_40,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkBufferView> create (const Environment& env, const Resources& res, const Parameters& params)
	{
		const VkBufferViewCreateInfo	bufferViewInfo	=
		{
			VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO,
			DE_NULL,
			(VkBufferViewCreateFlags)0,
			*res.buffer.object,
			params.format,
			params.offset,
			params.range
		};

		return createBufferView(env.vkd, env.device, &bufferViewInfo, env.allocationCallbacks);
	}